

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,string *keyword,cmExpandedCommandArgument *argument)

{
  __type _Var1;
  bool bVar2;
  ostream *poVar3;
  cmake *this_00;
  PolicyID id;
  string local_1b0;
  ostringstream e;
  
  if (((WARN < this->Policy54Status) && (argument->Quoted != false)) ||
     (_Var1 = std::operator==(&argument->Value,keyword), !_Var1)) {
    return false;
  }
  if (argument->Quoted != true) {
    return true;
  }
  if (this->Policy54Status != WARN) {
    return true;
  }
  bVar2 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext);
  if (bVar2) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b0,(cmPolicies *)0x36,id);
  poVar3 = std::operator<<((ostream *)&e,(string *)&local_1b0);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar3 = std::operator<<((ostream *)&e,"Quoted keywords like \"");
  poVar3 = std::operator<<(poVar3,(string *)argument);
  std::operator<<(poVar3,
                  "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 );
  this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
  std::__cxx11::stringbuf::str();
  cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1b0,&this->Backtrace,false);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return true;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(std::string const& keyword,
  cmExpandedCommandArgument& argument) const
{
  if((this->Policy54Status != cmPolicies::WARN &&
     this->Policy54Status != cmPolicies::OLD) &&
     argument.WasQuoted())
    {
    return false;
    }

  bool isKeyword = argument.GetValue() == keyword;

  if(isKeyword && argument.WasQuoted() &&
    this->Policy54Status == cmPolicies::WARN)
    {
    if(!this->Makefile.HasCMP0054AlreadyBeenReported(
         this->ExecutionContext))
      {
      std::ostringstream e;
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054) << "\n";
      e << "Quoted keywords like \"" << argument.GetValue() <<
        "\" will no longer be interpreted as keywords "
        "when the policy is set to NEW.  "
        "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()
          ->IssueMessage(cmake::AUTHOR_WARNING, e.str(),
                         this->Backtrace);
      }
    }

  return isKeyword;
}